

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

ssize_t Curl_bufq_slurp(bufq *q,Curl_bufq_reader *reader,void *reader_ctx,CURLcode *err)

{
  buf_chunk *pbVar1;
  long lVar2;
  ssize_t sVar3;
  long lVar4;
  
  *err = CURLE_AGAIN;
  lVar4 = 0;
  lVar2 = Curl_bufq_sipn(q,0,reader,reader_ctx,err);
  if (-1 < lVar2) {
    lVar4 = 0;
    do {
      if (lVar2 == 0) goto LAB_00112e80;
      lVar4 = lVar4 + lVar2;
      pbVar1 = q->tail;
      if ((pbVar1 != (buf_chunk *)0x0) && (pbVar1->w_offset < pbVar1->dlen)) {
        return lVar4;
      }
      lVar2 = Curl_bufq_sipn(q,0,reader,reader_ctx,err);
    } while (-1 < lVar2);
  }
  sVar3 = -1;
  if ((lVar4 != 0) && (*err == CURLE_AGAIN)) {
LAB_00112e80:
    sVar3 = lVar4;
    *err = CURLE_OK;
  }
  return sVar3;
}

Assistant:

ssize_t Curl_bufq_slurp(struct bufq *q, Curl_bufq_reader *reader,
                        void *reader_ctx, CURLcode *err)
{
  return bufq_slurpn(q, 0, reader, reader_ctx, err);
}